

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * __thiscall TestReaderTestparseWithNoErrors::testName(TestReaderTestparseWithNoErrors *this)

{
  TestReaderTestparseWithNoErrors *this_local;
  
  return "ReaderTest/parseWithNoErrors";
}

Assistant:

JSONTEST_FIXTURE(ReaderTest, parseWithNoErrors) {
  Json::Reader reader;
  Json::Value root;
  bool ok = reader.parse("{ \"property\" : \"value\" }", root);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(reader.getFormattedErrorMessages().size() == 0);
  JSONTEST_ASSERT(reader.getStructuredErrors().size() == 0);
}